

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
::clear(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
        *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  
  if (this->size_ != 0) {
    uVar3 = this->capacity_;
    if (uVar3 < 0x80) {
      if (uVar3 != 0) {
        lVar1 = 0;
        uVar2 = 0;
        do {
          if (-1 < this->ctrl_[uVar2]) {
            __gnu_cxx::new_allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>::
            destroy<std::pair<std::__cxx11::string,cs::csym_info>>
                      ((new_allocator<std::pair<std::__cxx11::string_const,cs::csym_info>> *)
                       &this->settings_,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>
                        *)((long)this->slots_ + lVar1));
            uVar3 = this->capacity_;
          }
          uVar2 = uVar2 + 1;
          lVar1 = lVar1 + 0x70;
        } while (uVar2 != uVar3);
        this->size_ = 0;
        memset(this->ctrl_,0x80,uVar3 + 0x10);
        this->ctrl_[uVar3] = -1;
        reset_growth_left(this,this->capacity_);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, cs::csym_info>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, cs::csym_info>>>::clear() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, cs::csym_info>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, cs::csym_info>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const
			{
				return !size();
			}